

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

_Bool rf_compute_glyph_metrics_from_image
                (rf_image image,rf_color key,int *codepoints,rf_glyph_info *dst,
                rf_int codepoints_and_dst_count)

{
  rf_color rVar1;
  ulong uVar2;
  _Bool _Var3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  void *src;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  void *pvVar21;
  
  _Var3 = (_Bool)((0 < codepoints_and_dst_count && dst != (rf_glyph_info *)0x0) &
                 codepoints != (int *)0x0 & image.valid);
  if (_Var3 == true) {
    uVar4 = 0;
    if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
      uVar4 = *(uint *)(&DAT_0017a7c8 + (ulong)(image.format - RF_UNCOMPRESSED_GRAYSCALE) * 4);
    }
    uVar10 = (ulong)(uint)image.width;
    uVar8 = (ulong)image.height;
    uVar5 = (ulong)uVar4;
    uVar2 = 0;
    uVar17 = 0;
    if (0 < (long)uVar8) {
      uVar7 = 0;
      pvVar21 = image.data;
      do {
        uVar16 = 0;
        rVar1.r = '\0';
        rVar1.g = '\0';
        rVar1.b = '\0';
        rVar1.a = '\0';
        if (image.width < 1) {
LAB_001352cc:
          uVar2 = uVar7;
          uVar17 = uVar16;
          if (rVar1 != key) break;
        }
        else {
          uVar16 = 0;
          src = pvVar21;
          do {
            rVar1 = rf_format_one_pixel_to_rgba32(src,image.format);
            if (rVar1 != key) goto LAB_001352cc;
            uVar16 = uVar16 + 1;
            src = (void *)((long)src + uVar5);
            uVar17 = uVar10;
          } while (uVar10 != uVar16);
        }
        uVar7 = uVar7 + 1;
        pvVar21 = (void *)((long)pvVar21 + uVar5 * uVar10);
        uVar2 = uVar8;
      } while (uVar7 != uVar8);
    }
    iVar6 = (int)uVar2;
    iVar13 = (int)uVar17;
    iVar18 = (iVar6 + -1) * image.width;
    pvVar21 = (void *)(((long)iVar6 * (long)image.width + (long)iVar13) * uVar5 + (long)image.data);
    iVar14 = -1;
    do {
      rVar1 = rf_format_one_pixel_to_rgba32(pvVar21,image.format);
      iVar18 = iVar18 + image.width;
      iVar14 = iVar14 + 1;
      pvVar21 = (void *)((long)pvVar21 + (long)image.width * uVar5);
    } while (rVar1 != key);
    if (iVar6 < image.height) {
      iVar9 = image.width * iVar6;
      iVar11 = 0;
      uVar2 = uVar2 & 0xffffffff;
      lVar12 = 0;
      do {
        if (iVar13 < image.width) {
          lVar12 = (long)(int)lVar12;
          uVar8 = uVar17 & 0xffffffff;
          do {
            iVar19 = (int)uVar8;
            rVar1 = rf_format_one_pixel_to_rgba32
                              ((void *)((long)(int)(((int)uVar2 * image.width + iVar19) * uVar4) +
                                       (long)image.data),image.format);
            if (rVar1 == key) break;
            pvVar21 = (void *)(((long)iVar19 + (long)iVar9) * uVar5 + (long)image.data);
            iVar15 = -1;
            do {
              rVar1 = rf_format_one_pixel_to_rgba32(pvVar21,image.format);
              iVar15 = iVar15 + 1;
              pvVar21 = (void *)((long)pvVar21 + uVar5);
            } while (rVar1 != key);
            dst[lVar12].codepoint = codepoints[lVar12];
            dst[lVar12].field_0.rec.x = (float)iVar19;
            dst[lVar12].field_0.rec.y = (float)(int)uVar2;
            dst[lVar12].field_0.rec.width = (float)iVar15;
            dst[lVar12].field_0.rec.height = (float)iVar14;
            dst[lVar12].offset_x = 0;
            dst[lVar12].offset_y = 0;
            dst[lVar12].advance_x = 0;
            lVar12 = lVar12 + 1;
            uVar20 = iVar19 + iVar13 + iVar15;
            uVar8 = (ulong)uVar20;
          } while ((int)uVar20 < image.width);
        }
        iVar11 = iVar11 + 1;
        uVar20 = iVar11 * (iVar6 + iVar14) + iVar6;
        uVar2 = (ulong)uVar20;
      } while (((int)uVar20 < image.height) &&
              (iVar9 = iVar9 + iVar18, (int)lVar12 < codepoints_and_dst_count));
    }
  }
  return _Var3;
}

Assistant:

RF_API bool rf_compute_glyph_metrics_from_image(rf_image image, rf_color key, const int* codepoints, rf_glyph_info* dst, rf_int codepoints_and_dst_count)
{
    bool result = false;

    if (image.valid && codepoints && dst && codepoints_and_dst_count > 0)
    {
        const int bpp = rf_bytes_per_pixel(image.format);
        const int image_data_size = rf_image_size(image);

        // This macro uses `bpp` and returns the pixel from the image at the index provided by calling rf_format_one_pixel_to_rgba32.
        #define RF_GET_PIXEL(index) rf_format_one_pixel_to_rgba32((char*)image.data + ((index) * bpp), image.format)

        // Parse image data to get char_spacing and line_spacing
        int char_spacing = 0;
        int line_spacing = 0;
        {
            int x = 0;
            int y = 0;
            for (y = 0; y < image.height; y++)
            {
                rf_color pixel = {0};
                for (x = 0; x < image.width; x++)
                {
                    pixel = RF_GET_PIXEL(y * image.width + x);
                    if (!rf_color_match(pixel, key)) break;
                }

                if (!rf_color_match(pixel, key)) break;
            }
            char_spacing = x;
            line_spacing = y;
        }

        // Compute char height
        int char_height = 0;
        {
            while (!rf_color_match(RF_GET_PIXEL((line_spacing + char_height) * image.width + char_spacing), key))
            {
                char_height++;
            }
        }

        // Check array values to get characters: value, x, y, w, h
        int index         = 0;
        int line_to_read  = 0;
        int x_pos_to_read = char_spacing;

        // Parse image data to get rectangle sizes
        while ((line_spacing + line_to_read * (char_height + line_spacing)) < image.height && index < codepoints_and_dst_count)
        {
            while (x_pos_to_read < image.width && !rf_color_match(RF_GET_PIXEL((line_spacing + (char_height + line_spacing) * line_to_read) * image.width + x_pos_to_read), key))
            {
                int char_width = 0;
                while (!rf_color_match(RF_GET_PIXEL(((line_spacing + (char_height + line_spacing) * line_to_read) * image.width + x_pos_to_read + char_width)), key)) {
                    char_width++;
                }

                dst[index].codepoint = codepoints[index];
                dst[index].x         = (float) x_pos_to_read;
                dst[index].y         = (float) (line_spacing + line_to_read * (char_height + line_spacing));
                dst[index].width     = (float) char_width;
                dst[index].height    = (float) char_height;

                // On image based fonts (XNA style), character offsets and x_advance are not required (set to 0)
                dst[index].offset_x  = 0;
                dst[index].offset_y  = 0;
                dst[index].advance_x = 0;

                index++;

                x_pos_to_read += (char_width + char_spacing);
            }

            line_to_read++;
            x_pos_to_read = char_spacing;
        }

        result = true;

        #undef RF_GET_PIXEL
    }

    return result;
}